

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.c
# Opt level: O2

long oggpack_look(oggpack_buffer *b,int bits)

{
  int iVar1;
  byte bVar2;
  ogg_reference *poVar3;
  byte *pbVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  
  iVar1 = b->headbit;
  uVar5 = bits + iVar1;
  uVar8 = b->headend;
  bVar2 = (byte)iVar1;
  if (uVar8 * 8 - (long)(int)uVar5 == 0 || (long)(uVar8 * 8) < (long)(int)uVar5) {
    if ((int)uVar8 < 0) {
      return -1;
    }
    if (uVar5 == 0) {
      uVar6 = 0xffffffffffffffff;
      goto LAB_0011e3cc;
    }
    pbVar4 = b->headptr;
    poVar3 = b->head;
    while ((int)uVar8 == 0) {
      poVar3 = poVar3->next;
      if (poVar3 == (ogg_reference *)0x0) {
        return -1;
      }
      pbVar4 = poVar3->buffer->data + poVar3->begin;
      uVar8 = (ulong)(uint)poVar3->length;
    }
    uVar6 = (ulong)(*pbVar4 >> (bVar2 & 0x1f));
    if ((int)uVar5 < 9) goto LAB_0011e3cc;
    pbVar4 = pbVar4 + 1;
    iVar7 = (int)uVar8 + -1;
    while (iVar7 == 0) {
      poVar3 = poVar3->next;
      if (poVar3 == (ogg_reference *)0x0) {
        return -1;
      }
      pbVar4 = poVar3->buffer->data + poVar3->begin;
      iVar7 = (int)poVar3->length;
    }
    uVar6 = (long)(int)((uint)*pbVar4 << (8 - bVar2 & 0x1f)) | uVar6;
    if ((int)uVar5 < 0x11) goto LAB_0011e3cc;
    pbVar4 = pbVar4 + 1;
    iVar7 = iVar7 + -1;
    while (iVar7 == 0) {
      poVar3 = poVar3->next;
      if (poVar3 == (ogg_reference *)0x0) {
        return -1;
      }
      pbVar4 = poVar3->buffer->data + poVar3->begin;
      iVar7 = (int)poVar3->length;
    }
    uVar6 = uVar6 | (long)(int)((uint)*pbVar4 << (0x10 - bVar2 & 0x1f));
    if ((int)uVar5 < 0x19) goto LAB_0011e3cc;
    pbVar4 = pbVar4 + 1;
    iVar7 = iVar7 + -1;
    while (iVar7 == 0) {
      poVar3 = poVar3->next;
      if (poVar3 == (ogg_reference *)0x0) {
        return -1;
      }
      pbVar4 = poVar3->buffer->data + poVar3->begin;
      iVar7 = (int)poVar3->length;
    }
    uVar6 = uVar6 | (long)(int)((uint)*pbVar4 << (0x18 - bVar2 & 0x1f));
    if (iVar1 == 0 || (int)uVar5 < 0x21) goto LAB_0011e3cc;
    pbVar4 = pbVar4 + 1;
    iVar7 = iVar7 + -1;
    while (iVar7 == 0) {
      poVar3 = poVar3->next;
      if (poVar3 == (ogg_reference *)0x0) {
        return -1;
      }
      pbVar4 = poVar3->buffer->data + poVar3->begin;
      iVar7 = (int)poVar3->length;
    }
  }
  else {
    pbVar4 = b->headptr;
    uVar6 = (ulong)(*pbVar4 >> (bVar2 & 0x1f));
    if (((((int)uVar5 < 9) ||
         (uVar6 = (long)(int)((uint)pbVar4[1] << (8 - bVar2 & 0x1f)) | uVar6, uVar5 < 0x11)) ||
        (uVar6 = uVar6 | (long)(int)((uint)pbVar4[2] << (0x10 - bVar2 & 0x1f)), uVar5 < 0x19)) ||
       (uVar6 = uVar6 | (long)(int)((uint)pbVar4[3] << (0x18 - bVar2 & 0x1f)),
       iVar1 == 0 || uVar5 < 0x21)) goto LAB_0011e3cc;
    pbVar4 = pbVar4 + 4;
  }
  uVar6 = (long)(int)((uint)*pbVar4 << (-bVar2 & 0x1f)) | uVar6;
LAB_0011e3cc:
  return uVar6 & mask[bits];
}

Assistant:

long oggpack_look(oggpack_buffer *b,int bits){
  unsigned long m=mask[bits];
  unsigned long ret=-1;

  bits+=b->headbit;

  if(bits >= b->headend<<3){
    int            end=b->headend;
    unsigned char *ptr=b->headptr;
    ogg_reference *head=b->head;

    if(end<0)return -1;
    
    if(bits){
      _lookspan();
      ret=*ptr++>>b->headbit;
      if(bits>8){
        --end;
        _lookspan();
        ret|=*ptr++<<(8-b->headbit);  
        if(bits>16){
          --end;
          _lookspan();
          ret|=*ptr++<<(16-b->headbit);  
          if(bits>24){
            --end;
            _lookspan();
            ret|=*ptr++<<(24-b->headbit);  
            if(bits>32 && b->headbit){
              --end;
              _lookspan();
              ret|=*ptr<<(32-b->headbit);
            }
          }
        }
      }
    }

  }else{

    /* make this a switch jump-table */
    ret=b->headptr[0]>>b->headbit;
    if(bits>8){
      ret|=b->headptr[1]<<(8-b->headbit);  
      if(bits>16){
        ret|=b->headptr[2]<<(16-b->headbit);  
        if(bits>24){
          ret|=b->headptr[3]<<(24-b->headbit);  
          if(bits>32 && b->headbit)
            ret|=b->headptr[4]<<(32-b->headbit);
        }
      }
    }
  }

  ret&=m;
  return ret;
}